

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_VisMF.cpp
# Opt level: O2

Long amrex::VisMF::Write(FabArray<amrex::FArrayBox> *mf,string *mf_name,How how,bool set_ghost)

{
  BoxArray *this;
  _Rb_tree_header *p_Var1;
  BaseFab<double> *pBVar2;
  pointer piVar3;
  FArrayBox *pFVar4;
  Version VVar5;
  unique_ptr<amrex::RealDescriptor,_std::default_delete<amrex::RealDescriptor>_> this_00;
  bool bVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  RealDescriptor *rd;
  size_type *psVar10;
  Vector<int,_std::allocator<int>_> *pVVar11;
  _Base_ptr p_Var12;
  FABio *pFVar13;
  Long LVar14;
  void *pvVar15;
  double *pdVar16;
  Version comm;
  _Head_base<0UL,_amrex::RealDescriptor_*,_false> _Var17;
  int procToWrite;
  void *__dest;
  int i;
  uint uVar18;
  long lVar19;
  long nitems;
  int j;
  DestComp dcomp;
  long lVar20;
  size_t __n;
  FabArray<amrex::FArrayBox> *the_mf;
  ulong uVar21;
  size_t __n_00;
  pair<double,_double> pVar22;
  unique_ptr<amrex::RealDescriptor,_std::default_delete<amrex::RealDescriptor>_> whichRD;
  int local_75c;
  Vector<int,_std::allocator<int>_> procsWithDataVector;
  __string_type tstr;
  MFIter mfi_1;
  string filePrefix;
  set<int,_std::less<int>,_std::allocator<int>_> procsWithData;
  stringstream hss;
  undefined1 local_628 [376];
  NFilesIter nfi;
  Header hdr;
  
  FArrayBox::getDataDescriptor();
  this_00 = whichRD;
  rd = FPC::NativeRealDescriptor();
  bVar6 = RealDescriptor::operator!=
                    ((RealDescriptor *)
                     this_00._M_t.
                     super___uniq_ptr_impl<amrex::RealDescriptor,_std::default_delete<amrex::RealDescriptor>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_amrex::RealDescriptor_*,_std::default_delete<amrex::RealDescriptor>_>
                     .super__Head_base<0UL,_amrex::RealDescriptor_*,_false>._M_head_impl,rd);
  if ((set_ghost) &&
     ((*(long *)(mf->super_FabArrayBase).n_grow.vect != 0 ||
      ((mf->super_FabArrayBase).n_grow.vect[2] != 0)))) {
    MFIter::MFIter((MFIter *)&nfi,&mf->super_FabArrayBase,'\0');
    this = &(mf->super_FabArrayBase).boxarray;
    while ((int)nfi.fullFileName._M_string_length <
           (int)nfi.fullFileName.field_2._M_allocated_capacity._0_4_) {
      iVar8 = *(int *)(*(long *)nfi.filePrefix._M_dataplus._M_p +
                      (long)(int)nfi.fullFileName._M_string_length * 4);
      for (dcomp.i = 0; dcomp.i < (mf->super_FabArrayBase).n_comp; dcomp.i = dcomp.i + 1) {
        psVar10 = &nfi.fullFileName._M_string_length;
        if (nfi.filePrefix._M_string_length != 0) {
          psVar10 = (size_type *)
                    ((long)(int)nfi.fullFileName._M_string_length * 4 +
                    *(long *)nfi.filePrefix._M_string_length);
        }
        pBVar2 = &(mf->m_fabs_v).
                  super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
                  _M_impl.super__Vector_impl_data._M_start[(int)*psVar10]->super_BaseFab<double>;
        BoxArray::operator[]((Box *)&hss,this,iVar8);
        pVar22 = BaseFab<double>::minmax<(amrex::RunOn)1>(pBVar2,(Box *)&hss,dcomp.i);
        hdr._0_8_ = (pVar22.second + pVar22.first) * 0.5;
        psVar10 = &nfi.fullFileName._M_string_length;
        if (nfi.filePrefix._M_string_length != 0) {
          psVar10 = (size_type *)
                    ((long)(int)nfi.fullFileName._M_string_length * 4 +
                    *(long *)nfi.filePrefix._M_string_length);
        }
        pBVar2 = &(mf->m_fabs_v).
                  super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
                  _M_impl.super__Vector_impl_data._M_start[(int)*psVar10]->super_BaseFab<double>;
        BoxArray::operator[]((Box *)&hss,this,iVar8);
        BaseFab<double>::setComplement<(amrex::RunOn)1>
                  (pBVar2,(double *)&hdr,(Box *)&hss,dcomp,(NumComps)0x1);
      }
      MFIter::operator++((MFIter *)&nfi);
    }
    MFIter::~MFIter((MFIter *)&nfi);
  }
  pVVar11 = DistributionMapping::ProcessorMap(&(mf->super_FabArrayBase).distributionMap);
  p_Var1 = &procsWithData._M_t._M_impl.super__Rb_tree_header;
  procsWithData._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  procsWithData._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  procsWithData._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  procsWithDataVector.super_vector<int,_std::allocator<int>_>.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)0x0;
  procsWithDataVector.super_vector<int,_std::allocator<int>_>.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  procsWithDataVector.super_vector<int,_std::allocator<int>_>.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  lVar20 = 0;
  lVar19 = 0;
  procsWithData._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  procsWithData._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  for (; piVar3 = (pVVar11->super_vector<int,_std::allocator<int>_>).
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start,
      lVar19 < (long)(pVVar11->super_vector<int,_std::allocator<int>_>).
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_finish - (long)piVar3 >> 2; lVar19 = lVar19 + 1) {
    std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
    _M_insert_unique<int_const&>
              ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
               &procsWithData,(int *)((long)piVar3 + lVar20));
    lVar20 = lVar20 + 4;
  }
  if ((allowSparseWrites == '\0') ||
     (nOutFiles <= (int)procsWithData._M_t._M_impl.super__Rb_tree_header._M_node_count)) {
    bVar7 = false;
  }
  else {
    for (p_Var12 = procsWithData._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var12 != p_Var1; p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12))
    {
      std::vector<int,_std::allocator<int>_>::push_back
                (&procsWithDataVector.super_vector<int,_std::allocator<int>_>,
                 (value_type_conflict *)(p_Var12 + 1));
    }
    bVar7 = true;
  }
  Header::Header(&hdr,mf,how,currentVersion,false,ParallelDescriptor::m_comm);
  std::operator+(&filePrefix,mf_name,"_D_");
  _Var17._M_head_impl = (RealDescriptor *)(ulong)(byte)groupSets;
  NFilesIter::NFilesIter(&nfi,nOutFiles,&filePrefix,(bool)groupSets,(bool)setBuf);
  VVar5 = currentVersion;
  if (bVar7) {
    NFilesIter::SetSparseFPP(&nfi,&procsWithDataVector);
  }
  else if (useDynamicSetSelection == '\x01') {
    NFilesIter::SetDynamic(&nfi,-1);
  }
  local_75c = 0;
  uVar21 = 0;
  do {
    bVar7 = NFilesIter::ReadyToWrite(&nfi,false);
    comm = (Version)_Var17._M_head_impl;
    if (!bVar7) {
      if (nfi.useStaticSetSelection == false) {
        local_75c = nfi.coordinatorProc;
      }
      if ((currentVersion & ~NoFabHeader_v1) == Version_v1) {
        Header::CalculateMinMax(&hdr,mf,procToWrite,comm);
      }
      FindOffsets(mf,&filePrefix,&hdr,comm,&nfi,ParallelDescriptor::m_comm);
      LVar14 = WriteHeader(mf_name,&hdr,local_75c,comm);
      NFilesIter::~NFilesIter(&nfi);
      std::__cxx11::string::~string((string *)&filePrefix);
      Header::~Header(&hdr);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&procsWithDataVector);
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                (&procsWithData._M_t);
      std::unique_ptr<amrex::RealDescriptor,_std::default_delete<amrex::RealDescriptor>_>::
      ~unique_ptr(&whichRD);
      return LVar14 + uVar21;
    }
    pFVar13 = FArrayBox::getFABio();
    iVar8 = RealDescriptor::numBytes
                      ((RealDescriptor *)
                       whichRD._M_t.
                       super___uniq_ptr_impl<amrex::RealDescriptor,_std::default_delete<amrex::RealDescriptor>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_amrex::RealDescriptor_*,_std::default_delete<amrex::RealDescriptor>_>
                       .super__Head_base<0UL,_amrex::RealDescriptor_*,_false>._M_head_impl);
    MFIter::MFIter(&mfi_1,&mf->super_FabArrayBase,'\0');
    lVar19 = (long)iVar8;
    uVar18 = 0;
    while (mfi_1.currentIndex < mfi_1.endIndex) {
      iVar8 = mfi_1.currentIndex;
      if (mfi_1.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
        iVar8 = ((mfi_1.local_index_map)->super_vector<int,_std::allocator<int>_>).
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start[mfi_1.currentIndex];
      }
      pFVar4 = (mf->m_fabs_v).
               super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>._M_impl.
               super__Vector_impl_data._M_start[iVar8];
      if (VVar5 == Version_v1) {
        std::__cxx11::stringstream::stringstream((stringstream *)&hss);
        (*pFVar13->_vptr_FABio[6])
                  (pFVar13,local_628,pFVar4,(ulong)(uint)(pFVar4->super_BaseFab<double>).nvar);
        lVar20 = std::ostream::tellp();
        uVar21 = uVar21 + lVar20;
        std::__cxx11::stringstream::~stringstream((stringstream *)&hss);
      }
      LVar14 = Box::numPts(&(pFVar4->super_BaseFab<double>).domain);
      _Var17._M_head_impl = (RealDescriptor *)((mf->super_FabArrayBase).n_comp * lVar19 * LVar14);
      uVar21 = (long)&((_Var17._M_head_impl)->fr).super_vector<long,_std::allocator<long>_>.
                      super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start + uVar21;
      uVar18 = uVar18 + 1;
      MFIter::operator++(&mfi_1);
    }
    MFIter::~MFIter(&mfi_1);
    if ((uVar18 < 2 && !bVar6) || (useSingleWrite != '\x01')) {
LAB_004fdc96:
      MFIter::MFIter(&mfi_1,&mf->super_FabArrayBase,'\0');
      while (mfi_1.currentIndex < mfi_1.endIndex) {
        iVar8 = mfi_1.currentIndex;
        if (mfi_1.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
          iVar8 = ((mfi_1.local_index_map)->super_vector<int,_std::allocator<int>_>).
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start[mfi_1.currentIndex];
        }
        _Var17._M_head_impl =
             (RealDescriptor *)
             (mf->m_fabs_v).
             super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>._M_impl.
             super__Vector_impl_data._M_start;
        pBVar2 = (BaseFab<double> *)
                 (&((_Var17._M_head_impl)->fr).super_vector<long,_std::allocator<long>_>.
                   super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                   _M_start)[iVar8];
        LVar14 = Box::numPts(&pBVar2->domain);
        iVar8 = (mf->super_FabArrayBase).n_comp;
        if (VVar5 == Version_v1) {
          std::__cxx11::stringstream::stringstream((stringstream *)&hss);
          _Var17._M_head_impl = (RealDescriptor *)(ulong)(uint)pBVar2->nvar;
          (*pFVar13->_vptr_FABio[6])(pFVar13,local_628,pBVar2);
          std::ostream::tellp();
          std::__cxx11::stringbuf::str();
          std::ostream::write(&nfi.field_0x80,(long)tstr._M_dataplus._M_p);
          std::ostream::flush();
          std::__cxx11::string::~string((string *)&tstr);
          std::__cxx11::stringstream::~stringstream((stringstream *)&hss);
        }
        lVar20 = LVar14 * iVar8;
        pdVar16 = BaseFab<double>::dataPtr(pBVar2,0);
        if (bVar6) {
          pvVar15 = operator_new__(lVar20 * lVar19);
          _Var17._M_head_impl = (RealDescriptor *)whichRD;
          RealDescriptor::convertFromNativeFormat
                    (pvVar15,lVar20,pdVar16,
                     (RealDescriptor *)
                     whichRD._M_t.
                     super___uniq_ptr_impl<amrex::RealDescriptor,_std::default_delete<amrex::RealDescriptor>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_amrex::RealDescriptor_*,_std::default_delete<amrex::RealDescriptor>_>
                     .super__Head_base<0UL,_amrex::RealDescriptor_*,_false>._M_head_impl);
          std::ostream::write(&nfi.field_0x80,(long)pvVar15);
          std::ostream::flush();
          operator_delete__(pvVar15);
        }
        else {
          std::ostream::write(&nfi.field_0x80,(long)pdVar16);
          std::ostream::flush();
        }
        MFIter::operator++(&mfi_1);
      }
      MFIter::~MFIter(&mfi_1);
    }
    else {
      pvVar15 = operator_new__(uVar21,(nothrow_t *)&std::nothrow);
      if (pvVar15 == (void *)0x0) goto LAB_004fdc96;
      MFIter::MFIter(&mfi_1,&mf->super_FabArrayBase,'\0');
      lVar20 = 0;
      while (mfi_1.currentIndex < mfi_1.endIndex) {
        iVar8 = mfi_1.currentIndex;
        if (mfi_1.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
          iVar8 = ((mfi_1.local_index_map)->super_vector<int,_std::allocator<int>_>).
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start[mfi_1.currentIndex];
        }
        _Var17._M_head_impl =
             (RealDescriptor *)
             (mf->m_fabs_v).
             super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>._M_impl.
             super__Vector_impl_data._M_start;
        pBVar2 = (BaseFab<double> *)
                 (&((_Var17._M_head_impl)->fr).super_vector<long,_std::allocator<long>_>.
                   super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                   _M_start)[iVar8];
        LVar14 = Box::numPts(&pBVar2->domain);
        iVar8 = (mf->super_FabArrayBase).n_comp;
        if (VVar5 == Version_v1) {
          std::__cxx11::stringstream::stringstream((stringstream *)&hss);
          _Var17._M_head_impl = (RealDescriptor *)(ulong)(uint)pBVar2->nvar;
          (*pFVar13->_vptr_FABio[6])(pFVar13,local_628);
          iVar9 = std::ostream::tellp();
          std::__cxx11::stringbuf::str();
          __n_00 = (size_t)iVar9;
          memcpy((void *)((long)pvVar15 + lVar20),tstr._M_dataplus._M_p,__n_00);
          std::__cxx11::string::~string((string *)&tstr);
          std::__cxx11::stringstream::~stringstream((stringstream *)&hss);
        }
        else {
          __n_00 = 0;
        }
        nitems = LVar14 * iVar8;
        __n = nitems * lVar19;
        pdVar16 = BaseFab<double>::dataPtr(pBVar2,0);
        __dest = (void *)((long)pvVar15 + lVar20 + __n_00);
        if (bVar6) {
          _Var17._M_head_impl = (RealDescriptor *)whichRD;
          RealDescriptor::convertFromNativeFormat
                    (__dest,nitems,pdVar16,
                     (RealDescriptor *)
                     whichRD._M_t.
                     super___uniq_ptr_impl<amrex::RealDescriptor,_std::default_delete<amrex::RealDescriptor>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_amrex::RealDescriptor_*,_std::default_delete<amrex::RealDescriptor>_>
                     .super__Head_base<0UL,_amrex::RealDescriptor_*,_false>._M_head_impl);
        }
        else {
          memcpy(__dest,pdVar16,__n);
        }
        lVar20 = __n + lVar20 + __n_00;
        MFIter::operator++(&mfi_1);
      }
      MFIter::~MFIter(&mfi_1);
      std::ostream::write(&nfi.field_0x80,(long)pvVar15);
      std::ostream::flush();
      operator_delete__(pvVar15);
    }
    NFilesIter::operator++(&nfi);
  } while( true );
}

Assistant:

Long
VisMF::Write (const FabArray<FArrayBox>&    mf,
              const std::string& mf_name,
              VisMF::How         how,
              bool               set_ghost)
{
    BL_PROFILE("VisMF::Write(FabArray)");
    BL_ASSERT(mf_name[mf_name.length() - 1] != '/');
    BL_ASSERT(currentVersion != VisMF::Header::Undefined_v1);

    // ---- add stream retry
    // ---- add stream buffer (to nfiles)
    auto whichRD = FArrayBox::getDataDescriptor();
    bool doConvert(*whichRD != FPC::NativeRealDescriptor());

    if(set_ghost && mf.nGrowVect() != 0) {
        FabArray<FArrayBox>* the_mf = const_cast<FabArray<FArrayBox>*>(&mf);

        bool run_on_device = Gpu::inLaunchRegion()
            && (mf.arena()->isManaged() || mf.arena()->isDevice());

        for(MFIter mfi(*the_mf); mfi.isValid(); ++mfi) {
            const int idx(mfi.index());

            for(int j(0); j < mf.nComp(); ++j) {
                auto mm = (run_on_device) ? mf[mfi].minmax<RunOn::Device>(mf.box(idx),j)
                                          : mf[mfi].minmax<RunOn::Host  >(mf.box(idx),j);
                const Real val = (mm.first + mm.second) / 2.0_rt;
                if (run_on_device) {
                    the_mf->get(mfi).setComplement<RunOn::Device>(val, mf.box(idx), j, 1);
                } else {
                    the_mf->get(mfi).setComplement<RunOn::Host>(val, mf.box(idx), j, 1);
                }
            }
        }
    }

    // ---- check if mf has sparse data
    bool useSparseFPP(false);
    const Vector<int> &pmap = mf.DistributionMap().ProcessorMap();
    std::set<int> procsWithData;
    Vector<int> procsWithDataVector;
    for(int i(0); i < pmap.size(); ++i) {
      procsWithData.insert(pmap[i]);
    }
    if(allowSparseWrites && (static_cast<int>(procsWithData.size()) < nOutFiles)) {
      useSparseFPP = true;
//      amrex::Print() << "SSSSSSSS:  in VisMF::Write:  useSparseFPP for:  " << mf_name << '\n';
      for(std::set<int>::iterator it = procsWithData.begin(); it != procsWithData.end(); ++it) {
        procsWithDataVector.push_back(*it);
      }
    }

    int coordinatorProc(ParallelDescriptor::IOProcessorNumber());
    Long bytesWritten(0);
    bool calcMinMax(false);
    VisMF::Header hdr(mf, how, currentVersion, calcMinMax);

    std::string filePrefix(mf_name + FabFileSuffix);

    NFilesIter nfi(nOutFiles, filePrefix, groupSets, setBuf);

    bool oldHeader(currentVersion == VisMF::Header::Version_v1);

    if(useSparseFPP) {
        nfi.SetSparseFPP(procsWithDataVector);
    } else if(useDynamicSetSelection) {
        nfi.SetDynamic();
    }
    for( ; nfi.ReadyToWrite(); ++nfi) {
        // ---- find the total number of bytes including fab headers if needed
        const FABio &fio = FArrayBox::getFABio();
        int whichRDBytes(whichRD->numBytes()), nFABs(0);
        Long writeDataItems(0), writeDataSize(0);
        for(MFIter mfi(mf); mfi.isValid(); ++mfi) {
            const FArrayBox &fab = mf[mfi];
            if(oldHeader) {
                std::stringstream hss;
                fio.write_header(hss, fab, fab.nComp());
                bytesWritten += static_cast<std::streamoff>(hss.tellp());
            }
            bytesWritten += fab.box().numPts() * mf.nComp() * whichRDBytes;
            ++nFABs;
        }
        char *allFabData(nullptr);
        bool canCombineFABs(false);
        if((nFABs > 1 || doConvert) && VisMF::useSingleWrite) {
            allFabData = new(std::nothrow) char[bytesWritten];
        }    // ---- else { no need to make a copy for one fab }
        if(allFabData == nullptr) {
            canCombineFABs = false;
        } else {
            canCombineFABs = true;
        }

        if(canCombineFABs) {
            Long writePosition(0);
            for(MFIter mfi(mf); mfi.isValid(); ++mfi) {
                int hLength(0);
                const FArrayBox &fab = mf[mfi];
                writeDataItems = fab.box().numPts() * mf.nComp();
                writeDataSize = writeDataItems * whichRDBytes;
                char *afPtr = allFabData + writePosition;
                if(oldHeader) {
                    std::stringstream hss;
                    fio.write_header(hss, fab, fab.nComp());
                    hLength = static_cast<std::streamoff>(hss.tellp());
                    auto tstr = hss.str();
                    std::memcpy(afPtr, tstr.c_str(), hLength);  // ---- the fab header
                }
                Real const* fabdata = fab.dataPtr();
#ifdef AMREX_USE_GPU
                std::unique_ptr<FArrayBox> hostfab;
                if (fab.arena()->isManaged() || fab.arena()->isDevice()) {
                    hostfab = std::make_unique<FArrayBox>(fab.box(), fab.nComp(),
                                                          The_Pinned_Arena());
                    Gpu::dtoh_memcpy_async(hostfab->dataPtr(), fab.dataPtr(),
                                           fab.size()*sizeof(Real));
                    Gpu::streamSynchronize();
                    fabdata = hostfab->dataPtr();
                }
#endif
                if(doConvert) {
                    RealDescriptor::convertFromNativeFormat(static_cast<void *> (afPtr + hLength),
                                                            writeDataItems,
                                                            fabdata, *whichRD);
                } else {    // ---- copy from the fab
                    memcpy(afPtr + hLength, fabdata, writeDataSize);
                }
                writePosition += hLength + writeDataSize;
            }
            nfi.Stream().write(allFabData, bytesWritten);
            nfi.Stream().flush();
            delete [] allFabData;

        } else {    // ---- write fabs individually
            for(MFIter mfi(mf); mfi.isValid(); ++mfi) {
                int hLength(0);
                const FArrayBox &fab = mf[mfi];
                writeDataItems = fab.box().numPts() * mf.nComp();
                writeDataSize = writeDataItems * whichRDBytes;
                if(oldHeader) {
                    std::stringstream hss;
                    fio.write_header(hss, fab, fab.nComp());
                    hLength = static_cast<std::streamoff>(hss.tellp());
                    auto tstr = hss.str();
                    nfi.Stream().write(tstr.c_str(), hLength);    // ---- the fab header
                    nfi.Stream().flush();
                }
                Real const* fabdata = fab.dataPtr();
#ifdef AMREX_USE_GPU
                std::unique_ptr<FArrayBox> hostfab;
                if (fab.arena()->isManaged() || fab.arena()->isDevice()) {
                    hostfab = std::make_unique<FArrayBox>(fab.box(), fab.nComp(),
                                                          The_Pinned_Arena());
                    Gpu::dtoh_memcpy_async(hostfab->dataPtr(), fab.dataPtr(),
                                           fab.size()*sizeof(Real));
                    Gpu::streamSynchronize();
                    fabdata = hostfab->dataPtr();
                }
#endif
                if(doConvert) {
                    char *cDataPtr = new char[writeDataSize];
                    RealDescriptor::convertFromNativeFormat(static_cast<void *> (cDataPtr),
                                                            writeDataItems,
                                                            fabdata, *whichRD);
                    nfi.Stream().write(cDataPtr, writeDataSize);
                    nfi.Stream().flush();
                    delete [] cDataPtr;
                } else {    // ---- copy from the fab
                    nfi.Stream().write((char *) fabdata, writeDataSize);
                    nfi.Stream().flush();
                }
            }
        }
    }

    if(nfi.GetDynamic()) {
        coordinatorProc = nfi.CoordinatorProc();
    }

    if(currentVersion == VisMF::Header::Version_v1 ||
       currentVersion == VisMF::Header::NoFabHeaderMinMax_v1)
    {
        hdr.CalculateMinMax(mf, coordinatorProc);
    }

    VisMF::FindOffsets(mf, filePrefix, hdr, currentVersion, nfi,
                       ParallelDescriptor::Communicator());

    bytesWritten += VisMF::WriteHeader(mf_name, hdr, coordinatorProc);

    return bytesWritten;
}